

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O1

qint64 __thiscall QDataStream::readBlock(QDataStream *this,char *data,qint64 len)

{
  bool bVar1;
  undefined7 extraout_var;
  ssize_t sVar2;
  size_t in_RCX;
  
  if (this->q_status != '\0') {
    bVar1 = QIODevice::isTransactionStarted(this->dev);
    in_RCX = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    if ((char)in_RCX != '\0') {
      return -1;
    }
  }
  sVar2 = QIODevice::read(this->dev,(int)data,(void *)len,in_RCX);
  if ((sVar2 != len) && (this->q_status == '\0')) {
    this->q_status = '\x01';
  }
  return sVar2;
}

Assistant:

qint64 QDataStream::readBlock(char *data, qint64 len)
{
    // Disable reads on failure in transacted stream
    if (q_status != Ok && dev->isTransactionStarted())
        return -1;

    const qint64 readResult = dev->read(data, len);
    if (readResult != len)
        setStatus(ReadPastEnd);
    return readResult;
}